

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testInfo)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  ColourImpl *pCVar4;
  undefined4 extraout_var_00;
  ostream *poVar5;
  ColourGuard local_28;
  TestRunInfo *local_18;
  TestRunInfo *_testInfo_local;
  ConsoleReporter *this_local;
  
  local_18 = _testInfo;
  _testInfo_local = (TestRunInfo *)this;
  StreamingReporterBase::testRunStarting(&this->super_StreamingReporterBase,_testInfo);
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar4 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_28,(Code)pCVar4);
    poVar5 = Catch::operator<<(poVar5,&local_28);
    poVar5 = std::operator<<(poVar5,"Filters: ");
    iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    poVar5 = Catch::operator<<(poVar5,(TestSpec *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar5,'\n');
    ColourImpl::ColourGuard::~ColourGuard(&local_28);
  }
  poVar5 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "Randomness seeded to: ");
  uVar3 = getSeed();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
  std::operator<<(poVar5,'\n');
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testInfo) {
    StreamingReporterBase::testRunStarting(_testInfo);
    if ( m_config->testSpec().hasFilters() ) {
        m_stream << m_colour->guardColour( Colour::BrightYellow ) << "Filters: "
                 << m_config->testSpec() << '\n';
    }
    m_stream << "Randomness seeded to: " << getSeed() << '\n';
}